

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O3

bool __thiscall
SmallDenseSet<InplaceStr,_InplaceStrHasher,_2U>::contains
          (SmallDenseSet<InplaceStr,_InplaceStrHasher,_2U> *this,InplaceStr *key)

{
  uint uVar1;
  InplaceStr *pIVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  byte bVar6;
  InplaceStr local_48;
  
  uVar1 = this->bucketCount;
  uVar4 = NULLC::GetStringHash(key->begin,key->end);
  uVar5 = 0;
  if (this->bucketCount != 0) {
    do {
      uVar4 = uVar4 & uVar1 - 1;
      pIVar2 = this->data;
      local_48.begin = (char *)0x0;
      local_48.end = (char *)0x0;
      bVar3 = InplaceStr::operator==(pIVar2 + uVar4,&local_48);
      if (bVar3) {
        bVar6 = 1;
        uVar5 = 0;
        goto LAB_0018b48d;
      }
      bVar3 = InplaceStr::operator==(pIVar2 + uVar4,key);
      if (bVar3) {
        bVar6 = 1;
        uVar5 = 1;
        goto LAB_0018b48d;
      }
      uVar4 = uVar4 + uVar5 + 1;
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->bucketCount);
    bVar6 = 0;
LAB_0018b48d:
    uVar5 = (uint)(bVar6 & (byte)uVar5);
  }
  return SUB41(uVar5,0);
}

Assistant:

bool contains(const Key& key)
	{
		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Key &item = data[bucket];

			if(item == Key())
				return false;

			if(item == key)
				return true;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		return false;
	}